

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toString_abi_cxx11_(wchar_t *value)

{
  wchar_t *in_RSI;
  string *in_RDI;
  allocator local_46;
  byte local_45;
  byte local_32;
  allocator local_31;
  wstring local_30 [24];
  wstring *in_stack_ffffffffffffffe8;
  
  local_32 = 0;
  local_45 = 0;
  if (in_RSI == (wchar_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"{null string}",&local_46);
    std::allocator<char>::~allocator((allocator<char> *)&local_46);
  }
  else {
    std::allocator<wchar_t>::allocator();
    local_32 = 1;
    std::__cxx11::wstring::wstring(local_30,in_RSI,&local_31);
    local_45 = 1;
    toString(in_stack_ffffffffffffffe8);
  }
  if ((local_45 & 1) != 0) {
    std::__cxx11::wstring::~wstring(local_30);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_31);
  }
  return in_RDI;
}

Assistant:

std::string toString( const wchar_t* const value )
{
	return value ? Catch::toString( std::wstring(value) ) : std::string( "{null string}" );
}